

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O1

FillRule lunasvg::parseFillRule(string_view *input)

{
  size_t __n;
  char *__s1;
  int iVar1;
  long lVar2;
  bool bVar3;
  
  __n = input->_M_len;
  __s1 = input->_M_str;
  lVar2 = 0x10;
  while( true ) {
    bVar3 = __n == *(size_t *)(&UNK_001599d8 + lVar2);
    if ((__n != 0) && (__n == *(size_t *)(&UNK_001599d8 + lVar2))) {
      iVar1 = bcmp(__s1,*(void **)(&parseFillRule::entries[0].first + lVar2),__n);
      bVar3 = iVar1 == 0;
    }
    if (bVar3) break;
    lVar2 = lVar2 + 0x18;
    if (lVar2 == 0x40) {
      return NonZero;
    }
  }
  return (&UNK_001599d0)[lVar2];
}

Assistant:

static FillRule parseFillRule(const std::string_view& input)
{
    static const SVGEnumerationEntry<FillRule> entries[] = {
        {FillRule::NonZero, "nonzero"},
        {FillRule::EvenOdd, "evenodd"}
    };

    return parseEnumValue(input, entries, FillRule::NonZero);
}